

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fkLookupParent(Parse *pParse,int iDb,Table *pTab,Index *pIdx,FKey *pFKey,int *aiCol,int regData
                   ,int nIncr,int isIgnore)

{
  i16 iVar1;
  int iVar2;
  int p1;
  int iVar3;
  Parse *pParse_00;
  long in_RCX;
  long in_RDX;
  Parse *in_RDI;
  long *in_R8;
  undefined4 *in_R9;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int iParent;
  int iChild;
  int iJump;
  int regTemp_1;
  int nCol;
  int regTemp;
  int iMustBeInt;
  int iReg;
  int iOk;
  int iCur;
  Vdbe *v;
  int i;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  Parse *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Parse *in_stack_ffffffffffffff80;
  Parse *in_stack_ffffffffffffff88;
  Parse *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int local_34;
  
  pParse_00 = (Parse *)sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffff6c,
                                                        in_stack_ffffffffffffff68));
  sqlite3VdbeMakeLabel(in_RDI);
  if (in_stack_00000010 < 0) {
    sqlite3VdbeAddOp2((Vdbe *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                      in_stack_ffffffffffffff68,0);
  }
  for (local_34 = 0; local_34 < (int)in_R8[5]; local_34 = local_34 + 1) {
    sqlite3TableColumnToStorage((Table *)*in_R8,(i16)in_R9[local_34]);
    sqlite3VdbeAddOp2((Vdbe *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                      in_stack_ffffffffffffff68,0);
  }
  iVar2 = in_stack_ffffffffffffff68;
  if (in_stack_00000018 == 0) {
    if (in_RCX == 0) {
      iVar2 = sqlite3GetTempReg(in_RDI);
      in_stack_ffffffffffffff90 = pParse_00;
      sqlite3TableColumnToStorage((Table *)*in_R8,(i16)*in_R9);
      sqlite3VdbeAddOp2((Vdbe *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                        in_stack_ffffffffffffff68,0);
      sqlite3VdbeAddOp2((Vdbe *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                        in_stack_ffffffffffffff68,0);
      if ((in_RDX == *in_R8) && (in_stack_00000010 == 1)) {
        sqlite3VdbeAddOp3((Vdbe *)in_stack_ffffffffffffff88,
                          (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                          (int)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78);
        sqlite3VdbeChangeP5((Vdbe *)pParse_00,0x90);
      }
      sqlite3OpenTable(in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                       (int)in_stack_ffffffffffffff88,(Table *)in_stack_ffffffffffffff80,
                       in_stack_ffffffffffffff7c);
      sqlite3VdbeAddOp3((Vdbe *)in_stack_ffffffffffffff88,
                        (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                        (int)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                        in_stack_ffffffffffffff78);
      sqlite3VdbeGoto((Vdbe *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      sqlite3VdbeCurrentAddr((Vdbe *)pParse_00);
      sqlite3VdbeJumpHere((Vdbe *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      sqlite3VdbeJumpHere((Vdbe *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      sqlite3ReleaseTempReg(in_RDI,iVar2);
      iVar2 = in_stack_ffffffffffffff68;
      in_stack_ffffffffffffff88 = pParse_00;
    }
    else {
      iVar2 = (int)in_R8[5];
      p1 = sqlite3GetTempRange((Parse *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78
                                                ),(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      sqlite3VdbeAddOp3((Vdbe *)in_stack_ffffffffffffff88,
                        (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                        (int)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                        in_stack_ffffffffffffff78);
      sqlite3VdbeSetP4KeyInfo
                (in_stack_ffffffffffffff80,
                 (Index *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      for (local_34 = 0; local_34 < iVar2; local_34 = local_34 + 1) {
        in_stack_ffffffffffffff80 = pParse_00;
        sqlite3TableColumnToStorage((Table *)*in_R8,(i16)in_R9[local_34]);
        sqlite3VdbeAddOp2((Vdbe *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                          in_stack_ffffffffffffff68,0);
      }
      if ((in_RDX == *in_R8) && (in_stack_00000010 == 1)) {
        iVar3 = sqlite3VdbeCurrentAddr((Vdbe *)pParse_00);
        in_stack_ffffffffffffffa0 = iVar3 + iVar2 + 1;
        for (local_34 = 0; local_34 < iVar2; local_34 = local_34 + 1) {
          iVar1 = sqlite3TableColumnToStorage((Table *)*in_R8,(i16)in_R9[local_34]);
          in_stack_ffffffffffffff9c = iVar1 + 1 + in_stack_00000008;
          iVar3 = in_stack_00000008 + 1;
          iVar1 = sqlite3TableColumnToStorage
                            (*(Table **)(in_RCX + 0x18),
                             *(i16 *)(*(long *)(in_RCX + 8) + (long)local_34 * 2));
          in_stack_ffffffffffffff98 = iVar1 + iVar3;
          if (*(short *)(*(long *)(in_RCX + 8) + (long)local_34 * 2) == *(short *)(in_RDX + 0x34)) {
            in_stack_ffffffffffffff98 = in_stack_00000008;
          }
          sqlite3VdbeAddOp3((Vdbe *)in_stack_ffffffffffffff88,
                            (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                            (int)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                            in_stack_ffffffffffffff78);
          sqlite3VdbeChangeP5((Vdbe *)pParse_00,0x10);
        }
        sqlite3VdbeGoto((Vdbe *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      }
      in_stack_ffffffffffffff7c = iVar2;
      in_stack_ffffffffffffffa4 = p1;
      sqlite3IndexAffinityStr
                ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 (Index *)0x2166ee);
      sqlite3VdbeAddOp4((Vdbe *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,p1,
                        (int)((ulong)pParse_00 >> 0x20),(int)pParse_00,
                        (char *)CONCAT44(in_stack_ffffffffffffff6c,iVar2),
                        (int)in_stack_ffffffffffffff90);
      sqlite3VdbeAddOp4Int
                ((Vdbe *)in_stack_ffffffffffffff88,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                 (int)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,p1,
                 (int)((ulong)pParse_00 >> 0x20));
      sqlite3ReleaseTempRange(pParse_00,in_stack_ffffffffffffff6c,iVar2);
      in_stack_ffffffffffffff70 = pParse_00;
    }
  }
  if ((((*(char *)((long)in_R8 + 0x2c) == '\0') && ((in_RDI->db->flags & 0x80000) == 0)) &&
      (in_RDI->pToplevel == (Parse *)0x0)) && (in_RDI->isMultiWrite == '\0')) {
    sqlite3HaltConstraint
              ((Parse *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90
               ,(i8)((ulong)in_stack_ffffffffffffff88 >> 0x38),
               (u8)((ulong)in_stack_ffffffffffffff88 >> 0x30));
  }
  else {
    if ((0 < in_stack_00000010) && (*(char *)((long)in_R8 + 0x2c) == '\0')) {
      sqlite3MayAbort(in_RDI);
    }
    sqlite3VdbeAddOp2((Vdbe *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,iVar2,0);
  }
  sqlite3VdbeResolveLabel((Vdbe *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  sqlite3VdbeAddOp1((Vdbe *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,iVar2);
  return;
}

Assistant:

static void fkLookupParent(
  Parse *pParse,        /* Parse context */
  int iDb,              /* Index of database housing pTab */
  Table *pTab,          /* Parent table of FK pFKey */
  Index *pIdx,          /* Unique index on parent key columns in pTab */
  FKey *pFKey,          /* Foreign key constraint */
  int *aiCol,           /* Map from parent key columns to child table columns */
  int regData,          /* Address of array containing child table row */
  int nIncr,            /* Increment constraint counter by this */
  int isIgnore          /* If true, pretend pTab contains all NULL values */
){
  int i;                                    /* Iterator variable */
  Vdbe *v = sqlite3GetVdbe(pParse);         /* Vdbe to add code to */
  int iCur = pParse->nTab - 1;              /* Cursor number to use */
  int iOk = sqlite3VdbeMakeLabel(pParse);   /* jump here if parent key found */

  sqlite3VdbeVerifyAbortable(v,
    (!pFKey->isDeferred
      && !(pParse->db->flags & SQLITE_DeferFKs)
      && !pParse->pToplevel
      && !pParse->isMultiWrite) ? OE_Abort : OE_Ignore);

  /* If nIncr is less than zero, then check at runtime if there are any
  ** outstanding constraints to resolve. If there are not, there is no need
  ** to check if deleting this row resolves any outstanding violations.
  **
  ** Check if any of the key columns in the child table row are NULL. If
  ** any are, then the constraint is considered satisfied. No need to
  ** search for a matching row in the parent table.  */
  if( nIncr<0 ){
    sqlite3VdbeAddOp2(v, OP_FkIfZero, pFKey->isDeferred, iOk);
    VdbeCoverage(v);
  }
  for(i=0; i<pFKey->nCol; i++){
    int iReg = sqlite3TableColumnToStorage(pFKey->pFrom,aiCol[i]) + regData + 1;
    sqlite3VdbeAddOp2(v, OP_IsNull, iReg, iOk); VdbeCoverage(v);
  }

  if( isIgnore==0 ){
    if( pIdx==0 ){
      /* If pIdx is NULL, then the parent key is the INTEGER PRIMARY KEY
      ** column of the parent table (table pTab).  */
      int iMustBeInt;               /* Address of MustBeInt instruction */
      int regTemp = sqlite3GetTempReg(pParse);

      /* Invoke MustBeInt to coerce the child key value to an integer (i.e.
      ** apply the affinity of the parent key). If this fails, then there
      ** is no matching parent key. Before using MustBeInt, make a copy of
      ** the value. Otherwise, the value inserted into the child key column
      ** will have INTEGER affinity applied to it, which may not be correct.  */
      sqlite3VdbeAddOp2(v, OP_SCopy,
        sqlite3TableColumnToStorage(pFKey->pFrom,aiCol[0])+1+regData, regTemp);
      iMustBeInt = sqlite3VdbeAddOp2(v, OP_MustBeInt, regTemp, 0);
      VdbeCoverage(v);

      /* If the parent table is the same as the child table, and we are about
      ** to increment the constraint-counter (i.e. this is an INSERT operation),
      ** then check if the row being inserted matches itself. If so, do not
      ** increment the constraint-counter.  */
      if( pTab==pFKey->pFrom && nIncr==1 ){
        sqlite3VdbeAddOp3(v, OP_Eq, regData, iOk, regTemp); VdbeCoverage(v);
        sqlite3VdbeChangeP5(v, SQLITE_NOTNULL);
      }

      sqlite3OpenTable(pParse, iCur, iDb, pTab, OP_OpenRead);
      sqlite3VdbeAddOp3(v, OP_NotExists, iCur, 0, regTemp); VdbeCoverage(v);
      sqlite3VdbeGoto(v, iOk);
      sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
      sqlite3VdbeJumpHere(v, iMustBeInt);
      sqlite3ReleaseTempReg(pParse, regTemp);
    }else{
      int nCol = pFKey->nCol;
      int regTemp = sqlite3GetTempRange(pParse, nCol);

      sqlite3VdbeAddOp3(v, OP_OpenRead, iCur, pIdx->tnum, iDb);
      sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
      for(i=0; i<nCol; i++){
        sqlite3VdbeAddOp2(v, OP_Copy,
               sqlite3TableColumnToStorage(pFKey->pFrom, aiCol[i])+1+regData,
               regTemp+i);
      }

      /* If the parent table is the same as the child table, and we are about
      ** to increment the constraint-counter (i.e. this is an INSERT operation),
      ** then check if the row being inserted matches itself. If so, do not
      ** increment the constraint-counter.
      **
      ** If any of the parent-key values are NULL, then the row cannot match
      ** itself. So set JUMPIFNULL to make sure we do the OP_Found if any
      ** of the parent-key values are NULL (at this point it is known that
      ** none of the child key values are).
      */
      if( pTab==pFKey->pFrom && nIncr==1 ){
        int iJump = sqlite3VdbeCurrentAddr(v) + nCol + 1;
        for(i=0; i<nCol; i++){
          int iChild = sqlite3TableColumnToStorage(pFKey->pFrom,aiCol[i])
                              +1+regData;
          int iParent = 1+regData;
          iParent += sqlite3TableColumnToStorage(pIdx->pTable,
                                                 pIdx->aiColumn[i]);
          assert( pIdx->aiColumn[i]>=0 );
          assert( aiCol[i]!=pTab->iPKey );
          if( pIdx->aiColumn[i]==pTab->iPKey ){
            /* The parent key is a composite key that includes the IPK column */
            iParent = regData;
          }
          sqlite3VdbeAddOp3(v, OP_Ne, iChild, iJump, iParent); VdbeCoverage(v);
          sqlite3VdbeChangeP5(v, SQLITE_JUMPIFNULL);
        }
        sqlite3VdbeGoto(v, iOk);
      }

      sqlite3VdbeAddOp4(v, OP_Affinity, regTemp, nCol, 0,
                        sqlite3IndexAffinityStr(pParse->db,pIdx), nCol);
      sqlite3VdbeAddOp4Int(v, OP_Found, iCur, iOk, regTemp, nCol);
      VdbeCoverage(v);
      sqlite3ReleaseTempRange(pParse, regTemp, nCol);
    }
  }

  if( !pFKey->isDeferred && !(pParse->db->flags & SQLITE_DeferFKs)
   && !pParse->pToplevel
   && !pParse->isMultiWrite
  ){
    /* Special case: If this is an INSERT statement that will insert exactly
    ** one row into the table, raise a constraint immediately instead of
    ** incrementing a counter. This is necessary as the VM code is being
    ** generated for will not open a statement transaction.  */
    assert( nIncr==1 );
    sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_FOREIGNKEY,
        OE_Abort, 0, P4_STATIC, P5_ConstraintFK);
  }else{
    if( nIncr>0 && pFKey->isDeferred==0 ){
      sqlite3MayAbort(pParse);
    }
    sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, nIncr);
  }

  sqlite3VdbeResolveLabel(v, iOk);
  sqlite3VdbeAddOp1(v, OP_Close, iCur);
}